

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrGetQueriedSenseDataBD
                   (XrSenseDataSnapshotBD snapshot,XrQueriedSenseDataGetInfoBD *getInfo,
                   XrQueriedSenseDataBD *queriedSenseData)

{
  long lVar1;
  XrResult XVar2;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  __hash_code __code;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_queriedSenseData;
  ostringstream oss_getInfo;
  ostringstream oss_snapshot;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [3];
  ios_base local_420 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [3];
  ios_base local_2a8 [264];
  unique_lock<std::mutex> local_1a0;
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  local_4e8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0._M_device = &g_sensedatasnapshotbd_dispatch_mutex;
  local_1a0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1a0);
  local_1a0._M_owns = true;
  p_Var3 = g_sensedatasnapshotbd_dispatch_map._M_h._M_buckets
           [(ulong)snapshot % g_sensedatasnapshotbd_dispatch_map._M_h._M_bucket_count];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var3->_M_nxt, p_Var4 = p_Var3,
     (XrSenseDataSnapshotBD)p_Var3->_M_nxt[1]._M_nxt != snapshot)) {
    while (p_Var3 = p_Var6, p_Var6 = p_Var3->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % g_sensedatasnapshotbd_dispatch_map._M_h._M_bucket_count !=
           (ulong)snapshot % g_sensedatasnapshotbd_dispatch_map._M_h._M_bucket_count) ||
         (p_Var4 = p_Var3, (XrSenseDataSnapshotBD)p_Var6[1]._M_nxt == snapshot)) goto LAB_00264074;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_00264074:
  if (p_Var4 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var4->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var6[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1a0);
  if (p_Var6 == (_Hash_node_base *)0x0) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[24],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_4e8,(char (*) [9])"XrResult",(char (*) [24])"xrGetQueriedSenseDataBD",
               (char (*) [1])0x2a4b54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    lVar1 = *(long *)((long)&local_1a0._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_1a0);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[22],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_4e8,(char (*) [22])"XrSenseDataSnapshotBD",(char (*) [9])"snapshot",
               local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318[0]._M_dataplus._M_p != &local_318[0].field_2) {
      operator_delete(local_318[0]._M_dataplus._M_p,local_318[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    *(uint *)((long)&local_318[0].field_2 + *(long *)(local_318[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_318[0].field_2 +
                  *(long *)(local_318[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_318);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[29],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_4e8,(char (*) [29])0x2ac3e0,(char (*) [8])"getInfo",local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490[0]._M_dataplus._M_p != &local_490[0].field_2) {
      operator_delete(local_490[0]._M_dataplus._M_p,local_490[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_490);
    *(uint *)((long)&local_490[0].field_2 + *(long *)(local_490[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_490[0].field_2 +
                  *(long *)(local_490[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_490);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[22],char_const(&)[17],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_4e8,(char (*) [22])0x2ac403,(char (*) [17])"queriedSenseData",&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_4a8,&local_4e8);
    ApiDumpLayerRecordContent(&local_4a8);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_4a8);
    XVar2 = (*(code *)p_Var5[0x11e]._M_nxt)(snapshot,getInfo,queriedSenseData);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_490);
    std::ios_base::~ios_base(local_420);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_4e8);
  return XVar2;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrGetQueriedSenseDataBD(
    XrSenseDataSnapshotBD snapshot,
    XrQueriedSenseDataGetInfoBD* getInfo,
    XrQueriedSenseDataBD* queriedSenseData) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_sensedatasnapshotbd_dispatch_mutex);
            auto map_iter = g_sensedatasnapshotbd_dispatch_map.find(snapshot);
            if (map_iter == g_sensedatasnapshotbd_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrGetQueriedSenseDataBD", "");
        std::ostringstream oss_snapshot;
        oss_snapshot << std::hex << reinterpret_cast<const void*>(snapshot);
        contents.emplace_back("XrSenseDataSnapshotBD", "snapshot", oss_snapshot.str());
        std::ostringstream oss_getInfo;
        oss_getInfo << std::hex << reinterpret_cast<const void*>(getInfo);
        contents.emplace_back("XrQueriedSenseDataGetInfoBD*", "getInfo", oss_getInfo.str());
        std::ostringstream oss_queriedSenseData;
        oss_queriedSenseData << std::hex << reinterpret_cast<const void*>(queriedSenseData);
        contents.emplace_back("XrQueriedSenseDataBD*", "queriedSenseData", oss_queriedSenseData.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->GetQueriedSenseDataBD(snapshot, getInfo, queriedSenseData);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}